

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UBool icu_63::UnicodeSet::resemblesPattern(UnicodeString *pattern,int32_t pos)

{
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  int iVar4;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (pos + 1 < iVar4) {
    cVar3 = UnicodeString::doCharAt(pattern,pos);
    if (cVar3 == L'[') {
      return '\x01';
    }
  }
  UVar2 = resemblesPropertyPattern(pattern,pos);
  return UVar2;
}

Assistant:

UBool UnicodeSet::resemblesPattern(const UnicodeString& pattern, int32_t pos) {
    return ((pos+1) < pattern.length() &&
            pattern.charAt(pos) == (UChar)91/*[*/) ||
        resemblesPropertyPattern(pattern, pos);
}